

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  size_t *psVar1;
  Counts *pCVar2;
  OfType OVar3;
  IStreamingReporter *pIVar4;
  pointer pSVar5;
  pointer pSVar6;
  pointer this_00;
  AssertionStats local_110;
  
  OVar3 = (result->m_resultData).resultType;
  if (OVar3 == Ok) {
    pCVar2 = &(this->m_totals).assertions;
    pCVar2->passed = pCVar2->passed + 1;
  }
  else if (((OVar3 & FailureBit) != Ok) &&
          (((result->m_info).resultDisposition & SuppressFail) == 0)) {
    this->m_lastAssertionPassed = false;
    if (((this->m_activeTestCase->super_TestCaseInfo).properties & (MayFail|ShouldFail)) == None) {
      psVar1 = &(this->m_totals).assertions.failed;
      *psVar1 = *psVar1 + 1;
    }
    else {
      psVar1 = &(this->m_totals).assertions.failedButOk;
      *psVar1 = *psVar1 + 1;
    }
    goto LAB_001234f7;
  }
  this->m_lastAssertionPassed = true;
LAB_001234f7:
  pIVar4 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  AssertionStats::AssertionStats(&local_110,result,&this->m_messages,&this->m_totals);
  (*pIVar4->_vptr_IStreamingReporter[10])(pIVar4,&local_110);
  AssertionStats::~AssertionStats(&local_110);
  if ((result->m_resultData).resultType != Warning) {
    pSVar5 = (this->m_messageScopes).
             super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl
             .super__Vector_impl_data._M_start;
    pSVar6 = (this->m_messageScopes).
             super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl
             .super__Vector_impl_data._M_finish;
    this_00 = pSVar5;
    if (pSVar6 != pSVar5) {
      do {
        ScopedMessage::~ScopedMessage(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pSVar6);
      (this->m_messageScopes).
      super__Vector_base<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar5;
    }
  }
  (this->m_lastAssertionInfo).macroName.m_start = "";
  (this->m_lastAssertionInfo).macroName.m_size = 0;
  (this->m_lastAssertionInfo).capturedExpression.m_start =
       "{Unknown expression after the reported line}";
  (this->m_lastAssertionInfo).capturedExpression.m_size = 0x2c;
  Option<Catch::AssertionResult>::operator=(&this->m_lastResult,result);
  return;
}

Assistant:

void RunContext::assertionEnded(AssertionResult const & result) {
        if (result.getResultType() == ResultWas::Ok) {
            m_totals.assertions.passed++;
            m_lastAssertionPassed = true;
        } else if (!result.isOk()) {
            m_lastAssertionPassed = false;
            if( m_activeTestCase->getTestCaseInfo().okToFail() )
                m_totals.assertions.failedButOk++;
            else
                m_totals.assertions.failed++;
        }
        else {
            m_lastAssertionPassed = true;
        }

        // We have no use for the return value (whether messages should be cleared), because messages were made scoped
        // and should be let to clear themselves out.
        static_cast<void>(m_reporter->assertionEnded(AssertionStats(result, m_messages, m_totals)));

        if (result.getResultType() != ResultWas::Warning)
            m_messageScopes.clear();

        // Reset working state
        resetAssertionInfo();
        m_lastResult = result;
    }